

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O3

bool rsg::(anonymous_namespace)::isConversionOk<bool,float>(ConstValueRangeAccess valueRange)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  float fVar4;
  
  fVar1 = (valueRange.m_min)->floatVal;
  fVar2 = (valueRange.m_max)->floatVal;
  if ((fVar1 <= 0.0) || (0.0 < fVar2)) {
    fVar4 = (float)(-(uint)(0.0 < fVar1) & 0x3f800000);
    bVar3 = 0;
    if ((fVar1 <= fVar4) && (fVar4 <= fVar2)) {
      fVar4 = (float)(~-(uint)(fVar2 <= 0.0) & 0x3f800000);
      bVar3 = -(fVar4 <= fVar2) & -(fVar1 <= fVar4);
    }
  }
  else {
    bVar3 = 0;
  }
  return (bool)(bVar3 & 1);
}

Assistant:

ConstValueAccess			getMin					(void) const	{ return ConstValueAccess(*m_type, m_min);	}